

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_4b1109::cmMacroFunctionBlocker::Replay
          (cmMacroFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *status)

{
  bool bVar1;
  cmMakefile *this_00;
  reference pvVar2;
  cmListFileContext *pcVar3;
  cmState *this_01;
  cmListFileContext local_1c8;
  undefined1 local_158 [32];
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  local_138;
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  local_118;
  undefined1 local_e8 [8];
  cmMacroHelperCommand f;
  allocator<char> local_49;
  string local_48;
  cmMakefile *local_28;
  cmMakefile *mf;
  cmExecutionStatus *status_local;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions_local;
  cmMacroFunctionBlocker *this_local;
  
  mf = (cmMakefile *)status;
  status_local = (cmExecutionStatus *)functions;
  functions_local = (vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)this;
  this_00 = cmExecutionStatus::GetMakefile(status);
  local_28 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"MACROS",&local_49);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->Args,0);
  cmMakefile::AppendProperty(this_00,&local_48,pvVar2,false);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  cmMacroHelperCommand::cmMacroHelperCommand((cmMacroHelperCommand *)local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8,&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
             &f.Args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,functions);
  pcVar3 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
  std::__cxx11::string::operator=
            ((string *)(f.Policies.Status.super__Base_bitset<7UL>._M_w + 6),
             (string *)&pcVar3->FilePath);
  cmMakefile::RecordPolicies
            (local_28,(PolicyMap *)
                      &f.Functions.
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  this_01 = cmMakefile::GetState(local_28);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->Args,0);
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<(anonymous_namespace)::cmMacroHelperCommand,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_138,(cmMacroHelperCommand *)local_e8);
  cmMakefile::GetBacktrace((cmMakefile *)local_158);
  pcVar3 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
  cmListFileContext::cmListFileContext(&local_1c8,pcVar3);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_158 + 0x10),
             (cmListFileContext *)local_158);
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  ::BT(&local_118,&local_138,(cmListFileBacktrace *)(local_158 + 0x10));
  bVar1 = cmState::AddScriptedCommand(this_01,pvVar2,&local_118,local_28);
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  ::~BT(&local_118);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_158 + 0x10));
  cmListFileContext::~cmListFileContext(&local_1c8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_158);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_138);
  cmMacroHelperCommand::~cmMacroHelperCommand((cmMacroHelperCommand *)local_e8);
  return bVar1;
}

Assistant:

bool cmMacroFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                    cmExecutionStatus& status)
{
  cmMakefile& mf = status.GetMakefile();
  mf.AppendProperty("MACROS", this->Args[0]);
  // create a new command and add it to cmake
  cmMacroHelperCommand f;
  f.Args = this->Args;
  f.Functions = std::move(functions);
  f.FilePath = this->GetStartingContext().FilePath;
  mf.RecordPolicies(f.Policies);
  return mf.GetState()->AddScriptedCommand(
    this->Args[0],
    BT<cmState::Command>(std::move(f),
                         mf.GetBacktrace().Push(this->GetStartingContext())),
    mf);
}